

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::IOBlock
          (IOBlock *this,string *blockName,string *interfaceName,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
          *members)

{
  pointer pMVar1;
  pointer __p;
  long lVar2;
  pointer __args;
  
  (this->super_TopLevelObject)._vptr_TopLevelObject = (_func_int **)&PTR__IOBlock_00a0b390;
  std::__cxx11::string::string((string *)&this->m_blockName,(string *)blockName);
  std::__cxx11::string::string((string *)&this->m_interfaceName,(string *)interfaceName);
  lVar2 = (long)(members->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(members->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                )._M_impl.super__Vector_impl_data._M_start;
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p = std::
        _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
        ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                       *)(lVar2 / 0x38),(size_t)interfaceName);
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = __p;
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = __p;
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar2 + (long)__p);
  pMVar1 = (members->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (members->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pMVar1; __args = __args + 1) {
    std::
    _Construct<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member_const&>
              (__p,__args);
    __p = __p + 1;
  }
  (this->m_members).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = __p;
  return;
}

Assistant:

IOBlock (const string& blockName, const string& interfaceName, const vector<Member>& members)
			: m_blockName		(blockName)
			, m_interfaceName	(interfaceName)
			, m_members			(members)
		{
		}